

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_extcomplex_str
               (lyout *out,int level,lys_module *module,lys_ext_instance_complex *ext,LY_STMT stmt,
               int *content)

{
  uint8_t substmt_index;
  long *plStack_48;
  int c;
  char **str;
  lyext_substmt *info;
  int *content_local;
  lys_ext_instance_complex *plStack_28;
  LY_STMT stmt_local;
  lys_ext_instance_complex *ext_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  info = (lyext_substmt *)content;
  content_local._4_4_ = stmt;
  plStack_28 = ext;
  ext_local = (lys_ext_instance_complex *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  plStack_48 = (long *)lys_ext_complex_get_substmt(stmt,ext,(lyext_substmt **)&str);
  if ((plStack_48 != (long *)0x0) && (*plStack_48 != 0)) {
    if (*(uint *)(str + 2) < 2) {
      yin_print_close_parent(plStack_10,&info->stmt);
      yin_print_substmt(plStack_10,module_local._4_4_,content_local._4_4_,'\0',(char *)*plStack_48,
                        (lys_module *)ext_local,plStack_28->ext,(uint)plStack_28->ext_size);
    }
    else {
      substmt_index = '\0';
      for (plStack_48 = (long *)*plStack_48; *plStack_48 != 0; plStack_48 = plStack_48 + 1) {
        yin_print_close_parent(plStack_10,&info->stmt);
        yin_print_substmt(plStack_10,module_local._4_4_,content_local._4_4_,substmt_index,
                          (char *)*plStack_48,(lys_module *)ext_local,plStack_28->ext,
                          (uint)plStack_28->ext_size);
        substmt_index = substmt_index + '\x01';
      }
    }
  }
  return;
}

Assistant:

static void
yin_print_extcomplex_str(struct lyout *out, int level, const struct lys_module *module,
                         struct lys_ext_instance_complex *ext, LY_STMT stmt, int *content)
{
    struct lyext_substmt *info;
    const char **str;
    int c;

    str = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!str || !(*str)) {
        return;
    }
    if (info->cardinality >= LY_STMT_CARD_SOME) {
        /* we have array */
        for (str = (const char **)(*str), c = 0; *str; str++, c++) {
            yin_print_close_parent(out, content);
            yin_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, c, *str, module, ext->ext, ext->ext_size);
        }
    } else {
        yin_print_close_parent(out, content);
        yin_print_substmt(out, level, (LYEXT_SUBSTMT)stmt, 0, *str, module, ext->ext, ext->ext_size);
    }
}